

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMeshCompare(FmsMesh lhs,FmsMesh rhs)

{
  int iVar1;
  FmsMesh in_RSI;
  FmsMesh in_RDI;
  FmsTag rhs_tag;
  FmsTag lhs_tag;
  FmsInt i_2;
  FmsInt rhs_ntags;
  FmsInt lhs_ntags;
  FmsComponent rhs_component;
  FmsComponent lhs_component;
  FmsInt i_1;
  FmsInt rhs_ncomponents;
  FmsInt lhs_ncomponents;
  FmsInt j;
  FmsDomain *rhs_domains;
  FmsDomain *lhs_domains;
  FmsInt rhs_ndomains;
  FmsInt lhs_ndomains;
  char *rhs_dname;
  char *lhs_dname;
  FmsInt i;
  FmsInt rhs_ndnames;
  FmsInt lhs_ndnames;
  int diff;
  FmsTag rhs_00;
  FmsTag lhs_00;
  FmsDomain in_stack_ffffffffffffff50;
  FmsDomain in_stack_ffffffffffffff58;
  ulong uVar2;
  FmsComponent in_stack_ffffffffffffff60;
  ulong uVar3;
  FmsComponent lhs_01;
  FmsComponent local_90;
  ulong local_88;
  FmsInt local_80;
  FmsInt local_78;
  ulong local_70;
  FmsDomain *local_68;
  FmsDomain *local_60;
  FmsInt local_58;
  FmsInt local_50;
  char *local_48;
  char *local_40;
  ulong local_38;
  FmsInt local_30;
  FmsInt local_28;
  int local_1c;
  FmsMesh local_18;
  FmsMesh local_10;
  int local_4;
  
  if (in_RDI == in_RSI) {
    local_4 = 0;
  }
  else if (in_RDI == (FmsMesh)0x0) {
    local_4 = -1;
  }
  else if (in_RSI == (FmsMesh)0x0) {
    local_4 = -2;
  }
  else {
    local_1c = 0;
    local_28 = 0;
    local_30 = 0xffffffffffffffff;
    local_18 = in_RSI;
    local_10 = in_RDI;
    FmsMeshGetNumDomainNames(in_RDI,&local_28);
    FmsMeshGetNumDomainNames(local_18,&local_30);
    if (local_28 == local_30) {
      for (local_38 = 0; local_38 < local_28; local_38 = local_38 + 1) {
        local_40 = (char *)0x0;
        local_48 = (char *)0x0;
        local_50 = 0;
        local_58 = 0xffffffffffffffff;
        local_60 = (FmsDomain *)0x0;
        local_68 = (FmsDomain *)0x0;
        FmsMeshGetDomains(local_10,local_38,&local_40,&local_50,&local_60);
        FmsMeshGetDomains(local_18,local_38,&local_48,&local_58,&local_68);
        iVar1 = strcmp(local_40,local_48);
        if (iVar1 == 0) {
          if (local_50 == local_58) {
            for (local_70 = 0; local_70 < local_28; local_70 = local_70 + 1) {
              iVar1 = FmsDomainCompare(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
              if (iVar1 != 0) {
                local_1c = local_1c + 100;
              }
            }
          }
          else {
            local_1c = local_1c + 10;
          }
        }
        else {
          local_1c = local_1c + 10;
        }
      }
    }
    else {
      local_1c = local_1c + 1;
    }
    local_78 = 0;
    local_80 = 0xffffffffffffffff;
    FmsMeshGetNumComponents(local_10,&local_78);
    FmsMeshGetNumComponents(local_18,&local_80);
    if (local_78 == local_80) {
      for (local_88 = 0; local_88 < local_78; local_88 = local_88 + 1) {
        local_90 = (FmsComponent)0x0;
        lhs_01 = (FmsComponent)0x0;
        FmsMeshGetComponent(local_10,local_88,&local_90);
        FmsMeshGetComponent(local_18,local_88,(FmsComponent *)&stack0xffffffffffffff68);
        iVar1 = FmsComponentCompare(lhs_01,in_stack_ffffffffffffff60);
        if (iVar1 != 0) {
          local_1c = local_1c + 1000;
        }
      }
    }
    else {
      local_1c = local_1c + 1000;
    }
    uVar3 = 0;
    uVar2 = 0xffffffffffffffff;
    FmsMeshGetNumTags(local_10,(FmsInt *)&stack0xffffffffffffff60);
    FmsMeshGetNumTags(local_18,(FmsInt *)&stack0xffffffffffffff58);
    if (uVar3 == uVar2) {
      for (uVar2 = 0; uVar2 < uVar3; uVar2 = uVar2 + 1) {
        lhs_00 = (FmsTag)0x0;
        rhs_00 = (FmsTag)0x0;
        FmsMeshGetTag(local_10,uVar2,(FmsTag *)&stack0xffffffffffffff48);
        FmsMeshGetTag(local_18,uVar2,(FmsTag *)&stack0xffffffffffffff40);
        iVar1 = FmsTagCompare(lhs_00,rhs_00);
        if (iVar1 != 0) {
          local_1c = local_1c + 10000;
        }
      }
    }
    else {
      local_1c = local_1c + 10000;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int FmsMeshCompare(FmsMesh lhs, FmsMesh rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;
  // Compare domain names size
  FmsInt lhs_ndnames = 0, rhs_ndnames = -1;
  FmsMeshGetNumDomainNames(lhs, &lhs_ndnames);
  FmsMeshGetNumDomainNames(rhs, &rhs_ndnames);

  // Compare domain names & domains
  if(lhs_ndnames != rhs_ndnames) {
    diff += 1;
  } else {
    for(FmsInt i = 0; i < lhs_ndnames; i++) {
      const char *lhs_dname = NULL, *rhs_dname = NULL;
      FmsInt lhs_ndomains = 0, rhs_ndomains = -1;
      FmsDomain *lhs_domains = NULL, *rhs_domains = NULL;
      FmsMeshGetDomains(lhs, i, &lhs_dname, &lhs_ndomains, &lhs_domains);
      FmsMeshGetDomains(rhs, i, &rhs_dname, &rhs_ndomains, &rhs_domains);
      if(strcmp(lhs_dname, rhs_dname)) {
        diff += 10;
        continue;
      }
      if(lhs_ndomains != rhs_ndomains) {
        diff += 10;
        continue;
      }
      for(FmsInt j = 0; j < lhs_ndnames; j++) {
        if(FmsDomainCompare(lhs_domains[j], rhs_domains[j])) {
          diff += 100;
        }
      }
    }
  }

  // Compare components
  FmsInt lhs_ncomponents = 0, rhs_ncomponents = -1;
  FmsMeshGetNumComponents(lhs, &lhs_ncomponents);
  FmsMeshGetNumComponents(rhs, &rhs_ncomponents);
  if(lhs_ncomponents != rhs_ncomponents) {
    diff += 1000;
  } else {
    for(FmsInt i = 0; i < lhs_ncomponents; i++) {
      FmsComponent lhs_component = NULL, rhs_component = NULL;
      FmsMeshGetComponent(lhs, i, &lhs_component);
      FmsMeshGetComponent(rhs, i, &rhs_component);
      if(FmsComponentCompare(lhs_component, rhs_component)) {
        diff += 1000;
      }
    }
  }

  // Compare tags
  FmsInt lhs_ntags = 0, rhs_ntags = -1;
  FmsMeshGetNumTags(lhs, &lhs_ntags);
  FmsMeshGetNumTags(rhs, &rhs_ntags);
  if(lhs_ntags != rhs_ntags) {
    diff += 10000;
  } else {
    for(FmsInt i = 0; i < lhs_ntags; i++) {
      FmsTag lhs_tag = NULL, rhs_tag = NULL;
      FmsMeshGetTag(lhs, i, &lhs_tag);
      FmsMeshGetTag(rhs, i, &rhs_tag);
      if(FmsTagCompare(lhs_tag, rhs_tag)) {
        diff += 10000;
      }
    }
  }

  // Q: Should we actually compare PartitionId?
  //  I feel like if two meshes identical meshes came from two different partitions
  //  then we should say they are equal.
  // FmsMeshGetPartitionId
  return diff;
}